

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O3

void testing::internal::UniversalPrinter<std::optional<SDL_Rect>_>::Print
               (Optional<SDL_Rect> *value,ostream *os)

{
  char local_12;
  char local_11;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_12,1);
  if ((value->super__Optional_base<SDL_Rect,_true,_true>)._M_payload.
      super__Optional_payload_base<SDL_Rect>._M_engaged == false) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"nullopt",7);
  }
  else {
    PrintBytesInObjectTo((uchar *)value,0x10,os);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_11,1);
  return;
}

Assistant:

static void Print(const Optional<T>& value, ::std::ostream* os) {
    *os << '(';
    if (!value) {
      *os << "nullopt";
    } else {
      UniversalPrint(*value, os);
    }
    *os << ')';
  }